

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_js_api_json_autogen.cpp
# Opt level: O0

DecodeLockingScriptStruct * __thiscall
cfd::js::api::json::DecodeLockingScript::ConvertToStruct
          (DecodeLockingScriptStruct *__return_storage_ptr__,DecodeLockingScript *this)

{
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_48;
  undefined1 local_19;
  DecodeLockingScript *local_18;
  DecodeLockingScript *this_local;
  DecodeLockingScriptStruct *result;
  
  local_19 = 0;
  local_18 = this;
  this_local = (DecodeLockingScript *)__return_storage_ptr__;
  DecodeLockingScriptStruct::DecodeLockingScriptStruct(__return_storage_ptr__);
  std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&this->asm__);
  std::__cxx11::string::operator=((string *)&__return_storage_ptr__->hex,(string *)&this->hex_);
  __return_storage_ptr__->req_sigs = this->req_sigs_;
  std::__cxx11::string::operator=((string *)&__return_storage_ptr__->type,(string *)&this->type_);
  core::
  JsonValueVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::ConvertToStruct(&local_48,&this->addresses_);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=(&__return_storage_ptr__->addresses,&local_48);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_48);
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=(&__return_storage_ptr__->ignore_items,&this->ignore_items);
  return __return_storage_ptr__;
}

Assistant:

DecodeLockingScriptStruct DecodeLockingScript::ConvertToStruct() const {  // NOLINT
  DecodeLockingScriptStruct result;
  result.asm_ = asm__;
  result.hex = hex_;
  result.req_sigs = req_sigs_;
  result.type = type_;
  result.addresses = addresses_.ConvertToStruct();
  result.ignore_items = ignore_items;
  return result;
}